

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Sopb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_44 = 8;
  local_40 = 0;
  local_48 = 0;
  fVerbose = 0;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"LWCRvh"), iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      pGVar3 = pAbc->pGia;
      if (pGVar3 != (Gia_Man_t *)0x0) {
        if (local_3c == 0 && local_40 == 0) {
          pGVar3 = Gia_ManPerformSopBalance(pGVar3,local_44,local_48,fVerbose);
        }
        else {
          pGVar3 = Gia_ManPerformSopBalanceWin(pGVar3,local_3c,local_40,local_44,local_48,fVerbose);
        }
        Abc_FrameUpdateGia(pAbc,pGVar3);
        return 0;
      }
      pcVar4 = "Abc_CommandAbc9Sopb(): There is no AIG.\n";
      iVar5 = -1;
      goto LAB_002517f6;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0025174d;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    else if (iVar1 == 0x57) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0025174d;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    else if (iVar1 == 0x52) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_0025174d;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
    else {
      if (iVar1 != 0x4c) goto LAB_00251757;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0025174d:
        Abc_Print(-1,pcVar4);
        goto LAB_00251757;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_3c = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_00251757:
      iVar5 = -2;
      Abc_Print(-2,"usage: &sopb [-LWCR num] [-vh]\n");
      Abc_Print(-2,"\t         performs SOP balancing\n");
      Abc_Print(-2,"\t-L num : optimize paths above this level [default = %d]\n",(ulong)local_3c);
      Abc_Print(-2,"\t-W num : optimize paths falling into this window [default = %d]\n",
                (ulong)local_40);
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-R num : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)local_48);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_002517f6:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sopb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int nLevelMax   = 0;
    int nTimeWindow = 0;
    int nCutNum     = 8;
    int nRelaxRatio = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LWCRvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRelaxRatio < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sopb(): There is no AIG.\n" );
        return 1;
    }
    if ( nLevelMax || nTimeWindow )
        pTemp = Gia_ManPerformSopBalanceWin( pAbc->pGia, nLevelMax, nTimeWindow, nCutNum, nRelaxRatio, fVerbose );
    else
        pTemp = Gia_ManPerformSopBalance( pAbc->pGia, nCutNum, nRelaxRatio, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &sopb [-LWCR num] [-vh]\n" );
    Abc_Print( -2, "\t         performs SOP balancing\n" );
    Abc_Print( -2, "\t-L num : optimize paths above this level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : optimize paths falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-R num : the delay relaxation ratio (num >= 0) [default = %d]\n", nRelaxRatio );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}